

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

int VectorMismatch_SSE2(uint32_t *array1,uint32_t *array2,int length)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  bool bVar12;
  uint uVar13;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  int local_130;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  __m128i cmpB;
  __m128i B1;
  __m128i B0;
  __m128i cmpA;
  __m128i A1;
  __m128i A0;
  int iStack_10;
  int iStack_c;
  int match_len;
  int length_local;
  
  if (length < 0xc) {
    local_130 = 0;
    iVar10 = local_130;
    if (3 < length) {
      B1[1]._0_4_ = (int)*(undefined8 *)array1;
      B1[1]._4_4_ = (int)((ulong)*(undefined8 *)array1 >> 0x20);
      B0[0]._0_4_ = (int)*(undefined8 *)(array1 + 2);
      B0[0]._4_4_ = (int)((ulong)*(undefined8 *)(array1 + 2) >> 0x20);
      cmpB[1]._0_4_ = (int)*(undefined8 *)array2;
      cmpB[1]._4_4_ = (int)((ulong)*(undefined8 *)array2 >> 0x20);
      B1[0]._0_4_ = (int)*(undefined8 *)(array2 + 2);
      B1[0]._4_4_ = (int)((ulong)*(undefined8 *)(array2 + 2) >> 0x20);
      uVar13 = -(uint)(B0[0]._4_4_ == B1[0]._4_4_);
      auVar7._4_4_ = -(uint)(B1[1]._4_4_ == cmpB[1]._4_4_);
      auVar7._0_4_ = -(uint)((int)B1[1] == (int)cmpB[1]);
      auVar7._8_4_ = -(uint)((int)B0[0] == (int)B1[0]);
      auVar7._12_4_ = uVar13;
      if (((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                    (ushort)((byte)(uVar13 >> 7) & 1) << 0xc |
                    (ushort)((byte)(uVar13 >> 0xf) & 1) << 0xd |
                    (ushort)((byte)(uVar13 >> 0x17) & 1) << 0xe |
                   (ushort)(byte)(uVar13 >> 0x1f) << 0xf) == 0xffff) &&
         (local_130 = 4, iVar10 = local_130, 7 < length)) {
        iStack_78 = (int)*(undefined8 *)(array1 + 4);
        iStack_74 = (int)((ulong)*(undefined8 *)(array1 + 4) >> 0x20);
        cmpB[0]._0_4_ = (int)*(undefined8 *)(array1 + 6);
        cmpB[0]._4_4_ = (int)((ulong)*(undefined8 *)(array1 + 6) >> 0x20);
        local_88 = (int)*(undefined8 *)(array2 + 4);
        iStack_84 = (int)((ulong)*(undefined8 *)(array2 + 4) >> 0x20);
        iStack_80 = (int)*(undefined8 *)(array2 + 6);
        iStack_7c = (int)((ulong)*(undefined8 *)(array2 + 6) >> 0x20);
        uVar13 = -(uint)(cmpB[0]._4_4_ == iStack_7c);
        auVar6._4_4_ = -(uint)(iStack_74 == iStack_84);
        auVar6._0_4_ = -(uint)(iStack_78 == local_88);
        auVar6._8_4_ = -(uint)((int)cmpB[0] == iStack_80);
        auVar6._12_4_ = uVar13;
        if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)((byte)(uVar13 >> 7) & 1) << 0xc |
                     (ushort)((byte)(uVar13 >> 0xf) & 1) << 0xd |
                     (ushort)((byte)(uVar13 >> 0x17) & 1) << 0xe |
                    (ushort)(byte)(uVar13 >> 0x1f) << 0xf) == 0xffff) {
          local_130 = 8;
          iVar10 = local_130;
        }
      }
    }
  }
  else {
    local_148 = *(undefined8 *)array1;
    uStack_140 = *(undefined8 *)(array1 + 2);
    local_158 = *(undefined8 *)array2;
    uStack_150 = *(undefined8 *)(array2 + 2);
    local_130 = 0;
    while( true ) {
      A0[1]._0_4_ = (int)local_148;
      A0[1]._4_4_ = (int)((ulong)local_148 >> 0x20);
      iStack_10 = (int)uStack_140;
      iStack_c = (int)((ulong)uStack_140 >> 0x20);
      A1[1]._0_4_ = (int)local_158;
      A1[1]._4_4_ = (int)((ulong)local_158 >> 0x20);
      A0[0]._0_4_ = (int)uStack_150;
      A0[0]._4_4_ = (int)((ulong)uStack_150 >> 0x20);
      uVar13 = -(uint)(iStack_c == A0[0]._4_4_);
      uVar1 = *(undefined8 *)(array1 + (local_130 + 4));
      uVar2 = *(undefined8 *)(array1 + (local_130 + 4) + 2);
      uVar3 = *(undefined8 *)(array2 + (local_130 + 4));
      uVar4 = *(undefined8 *)(array2 + (local_130 + 4) + 2);
      auVar9._4_4_ = -(uint)(A0[1]._4_4_ == A1[1]._4_4_);
      auVar9._0_4_ = -(uint)((int)A0[1] == (int)A1[1]);
      uVar5 = CONCAT44(uVar13,-(uint)(iStack_10 == (int)A0[0]));
      auVar9._8_8_ = uVar5;
      iVar10 = local_130;
      if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                   (ushort)((byte)(uVar5 >> 7) & 1) << 8 | (ushort)((byte)(uVar5 >> 0xf) & 1) << 9 |
                   (ushort)((byte)(uVar5 >> 0x17) & 1) << 10 |
                   (ushort)((byte)(uVar5 >> 0x1f) & 1) << 0xb |
                   (ushort)((byte)(uVar13 >> 7) & 1) << 0xc |
                   (ushort)((byte)(uVar13 >> 0xf) & 1) << 0xd |
                   (ushort)((byte)(uVar13 >> 0x17) & 1) << 0xe |
                  (ushort)(byte)(uVar13 >> 0x1f) << 0xf) != 0xffff) break;
      cmpA[1]._0_4_ = (int)uVar1;
      cmpA[1]._4_4_ = (int)((ulong)uVar1 >> 0x20);
      A1[0]._0_4_ = (int)uVar2;
      A1[0]._4_4_ = (int)((ulong)uVar2 >> 0x20);
      B0[1]._0_4_ = (int)uVar3;
      B0[1]._4_4_ = (int)((ulong)uVar3 >> 0x20);
      cmpA[0]._0_4_ = (int)uVar4;
      cmpA[0]._4_4_ = (int)((ulong)uVar4 >> 0x20);
      uVar13 = -(uint)(A1[0]._4_4_ == cmpA[0]._4_4_);
      local_148 = *(undefined8 *)(array1 + (local_130 + 8));
      uStack_140 = *(undefined8 *)(array1 + (local_130 + 8) + 2);
      local_158 = *(undefined8 *)(array2 + (local_130 + 8));
      uStack_150 = *(undefined8 *)(array2 + (local_130 + 8) + 2);
      auVar8._4_4_ = -(uint)(cmpA[1]._4_4_ == B0[1]._4_4_);
      auVar8._0_4_ = -(uint)((int)cmpA[1] == (int)B0[1]);
      uVar5 = CONCAT44(uVar13,-(uint)((int)A1[0] == (int)cmpA[0]));
      auVar8._8_8_ = uVar5;
      iVar10 = local_130 + 4;
      if (((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                    (ushort)((byte)(uVar5 >> 7) & 1) << 8 | (ushort)((byte)(uVar5 >> 0xf) & 1) << 9
                    | (ushort)((byte)(uVar5 >> 0x17) & 1) << 10 |
                    (ushort)((byte)(uVar5 >> 0x1f) & 1) << 0xb |
                    (ushort)((byte)(uVar13 >> 7) & 1) << 0xc |
                    (ushort)((byte)(uVar13 >> 0xf) & 1) << 0xd |
                    (ushort)((byte)(uVar13 >> 0x17) & 1) << 0xe |
                   (ushort)(byte)(uVar13 >> 0x1f) << 0xf) != 0xffff) ||
         (iVar11 = local_130 + 0x14, iVar10 = local_130 + 8, local_130 = local_130 + 8,
         length <= iVar11)) break;
    }
  }
  while( true ) {
    local_130 = iVar10;
    bVar12 = false;
    if (local_130 < length) {
      bVar12 = array1[local_130] == array2[local_130];
    }
    if (!bVar12) break;
    iVar10 = local_130 + 1;
  }
  return local_130;
}

Assistant:

static int VectorMismatch_SSE2(const uint32_t* const array1,
                               const uint32_t* const array2, int length) {
  int match_len;

  if (length >= 12) {
    __m128i A0 = _mm_loadu_si128((const __m128i*)&array1[0]);
    __m128i A1 = _mm_loadu_si128((const __m128i*)&array2[0]);
    match_len = 0;
    do {
      // Loop unrolling and early load both provide a speedup of 10% for the
      // current function. Also, max_limit can be MAX_LENGTH=4096 at most.
      const __m128i cmpA = _mm_cmpeq_epi32(A0, A1);
      const __m128i B0 =
          _mm_loadu_si128((const __m128i*)&array1[match_len + 4]);
      const __m128i B1 =
          _mm_loadu_si128((const __m128i*)&array2[match_len + 4]);
      if (_mm_movemask_epi8(cmpA) != 0xffff) break;
      match_len += 4;

      {
        const __m128i cmpB = _mm_cmpeq_epi32(B0, B1);
        A0 = _mm_loadu_si128((const __m128i*)&array1[match_len + 4]);
        A1 = _mm_loadu_si128((const __m128i*)&array2[match_len + 4]);
        if (_mm_movemask_epi8(cmpB) != 0xffff) break;
        match_len += 4;
      }
    } while (match_len + 12 < length);
  } else {
    match_len = 0;
    // Unroll the potential first two loops.
    if (length >= 4 &&
        _mm_movemask_epi8(_mm_cmpeq_epi32(
            _mm_loadu_si128((const __m128i*)&array1[0]),
            _mm_loadu_si128((const __m128i*)&array2[0]))) == 0xffff) {
      match_len = 4;
      if (length >= 8 &&
          _mm_movemask_epi8(_mm_cmpeq_epi32(
              _mm_loadu_si128((const __m128i*)&array1[4]),
              _mm_loadu_si128((const __m128i*)&array2[4]))) == 0xffff) {
        match_len = 8;
      }
    }
  }

  while (match_len < length && array1[match_len] == array2[match_len]) {
    ++match_len;
  }
  return match_len;
}